

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::addStorage
          (Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *this)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  Entry *pEVar13;
  uchar *puVar14;
  Entry *pEVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  size_t i;
  long lVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar45;
  undefined1 auVar43 [16];
  int iVar46;
  undefined1 auVar44 [16];
  int iVar47;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar71;
  undefined1 auVar70 [16];
  int iVar72;
  long lVar73;
  long lVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long lVar82;
  long lVar83;
  
  bVar3 = this->allocated;
  if (bVar3 == 0x30) {
    lVar19 = 0x50;
    uVar18 = 0xc80;
LAB_00160d44:
    pEVar13 = (Entry *)operator_new__(uVar18);
    lVar16 = 0x18;
    uVar18 = 0;
    do {
      puVar14 = (pEVar13->storage).data + lVar16 + -0x18;
      pEVar15 = this->entries;
      puVar1 = (pEVar15->storage).data + lVar16 + -0x18;
      uVar12 = *(undefined8 *)(puVar1 + 8);
      puVar2 = (pEVar13->storage).data + lVar16 + -0x18;
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 8) = uVar12;
      *(undefined8 *)((pEVar13->storage).data + lVar16 + -8) =
           *(undefined8 *)((pEVar15->storage).data + lVar16 + -8);
      *(undefined8 *)((pEVar13->storage).data + lVar16) =
           *(undefined8 *)((pEVar15->storage).data + lVar16);
      *(undefined8 *)((pEVar13->storage).data + lVar16 + 8) =
           *(undefined8 *)((pEVar15->storage).data + lVar16 + 8);
      puVar1 = (pEVar15->storage).data + lVar16;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(uchar **)(*(long *)((pEVar13->storage).data + lVar16 + -0x18) + 8) = puVar14;
      **(undefined8 **)((pEVar13->storage).data + lVar16 + -0x10) = puVar14;
      QCache<unsigned_long_long,_QOpenGLCachedTexture>::Value::~Value
                ((Value *)((pEVar15->storage).data + lVar16));
      uVar18 = uVar18 + 1;
      uVar20 = (ulong)this->allocated;
      lVar16 = lVar16 + 0x28;
    } while (uVar18 < uVar20);
    if ((uint)lVar19 <= (uint)this->allocated) goto LAB_00161472;
  }
  else {
    if (bVar3 != 0) {
      lVar19 = (ulong)bVar3 + 0x10;
      uVar18 = (ulong)(uint)((int)lVar19 * 8) * 5;
      goto LAB_00160d44;
    }
    pEVar13 = (Entry *)operator_new__(0x780);
    lVar19 = 0x30;
    uVar20 = 0;
  }
  lVar16 = lVar19 - uVar20;
  lVar17 = lVar16 + -1;
  lVar73 = uVar20 + 0xe;
  lVar81 = uVar20 + 0xf;
  lVar31 = uVar20 + 0xc;
  lVar32 = uVar20 + 0xd;
  lVar33 = uVar20 + 10;
  lVar34 = uVar20 + 0xb;
  lVar35 = uVar20 + 8;
  lVar36 = uVar20 + 9;
  lVar37 = uVar20 + 6;
  lVar38 = uVar20 + 7;
  lVar39 = uVar20 + 4;
  lVar40 = uVar20 + 5;
  lVar82 = uVar20 + 2;
  lVar83 = uVar20 + 3;
  lVar21 = uVar20 + 1;
  auVar22._8_4_ = (int)lVar17;
  auVar22._0_8_ = lVar17;
  auVar22._12_4_ = (int)((ulong)lVar17 >> 0x20);
  pEVar15 = pEVar13 + uVar20;
  uVar18 = 0;
  do {
    auVar70._8_4_ = (int)uVar18;
    auVar70._0_8_ = uVar18;
    auVar70._12_4_ = (int)(uVar18 >> 0x20);
    auVar43 = auVar22 ^ _DAT_00178230;
    auVar41 = (auVar70 | _DAT_00178220) ^ _DAT_00178230;
    iVar71 = auVar43._0_4_;
    iVar47 = -(uint)(iVar71 < auVar41._0_4_);
    iVar72 = auVar43._4_4_;
    iVar58 = -(uint)(iVar72 < auVar41._4_4_);
    iVar45 = auVar43._8_4_;
    iVar59 = -(uint)(iVar45 < auVar41._8_4_);
    iVar46 = auVar43._12_4_;
    iVar60 = -(uint)(iVar46 < auVar41._12_4_);
    auVar74._4_4_ = iVar47;
    auVar74._0_4_ = iVar47;
    auVar74._8_4_ = iVar59;
    auVar74._12_4_ = iVar59;
    auVar66 = pshuflw(in_XMM12,auVar74,0xe8);
    auVar48._4_4_ = -(uint)(auVar41._4_4_ == iVar72);
    auVar48._12_4_ = -(uint)(auVar41._12_4_ == iVar46);
    auVar48._0_4_ = auVar48._4_4_;
    auVar48._8_4_ = auVar48._12_4_;
    auVar61 = pshuflw(in_XMM10,auVar48,0xe8);
    auVar42._4_4_ = iVar58;
    auVar42._0_4_ = iVar58;
    auVar42._8_4_ = iVar60;
    auVar42._12_4_ = iVar60;
    auVar43 = pshuflw(_DAT_00178230,auVar42,0xe8);
    auVar41._8_4_ = 0xffffffff;
    auVar41._0_8_ = 0xffffffffffffffff;
    auVar41._12_4_ = 0xffffffff;
    auVar41 = (auVar43 | auVar61 & auVar66) ^ auVar41;
    auVar41 = packssdw(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (pEVar15->storage).data[0] = (char)uVar20 + '\x01';
    }
    auVar42 = auVar48 & auVar74 | auVar42;
    auVar41 = packssdw(auVar42,auVar42);
    auVar43._8_4_ = 0xffffffff;
    auVar43._0_8_ = 0xffffffffffffffff;
    auVar43._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41 ^ auVar43,auVar41 ^ auVar43);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._0_4_ >> 8 & 1) != 0) {
      pEVar15[1].storage.data[0] = (char)lVar21 + '\x01';
    }
    auVar41 = (auVar70 | _DAT_00178210) ^ _DAT_00178230;
    iVar47 = -(uint)(iVar71 < auVar41._0_4_);
    iVar59 = -(uint)(iVar72 < auVar41._4_4_);
    iVar58 = -(uint)(iVar45 < auVar41._8_4_);
    iVar60 = -(uint)(iVar46 < auVar41._12_4_);
    auVar66._4_4_ = iVar47;
    auVar66._0_4_ = iVar47;
    auVar66._8_4_ = iVar58;
    auVar66._12_4_ = iVar58;
    iVar47 = -(uint)(auVar41._4_4_ == iVar72);
    iVar58 = -(uint)(auVar41._12_4_ == iVar46);
    auVar75._4_4_ = iVar47;
    auVar75._0_4_ = iVar47;
    auVar75._8_4_ = iVar58;
    auVar75._12_4_ = iVar58;
    auVar67._4_4_ = iVar59;
    auVar67._0_4_ = iVar59;
    auVar67._8_4_ = iVar60;
    auVar67._12_4_ = iVar60;
    auVar41 = auVar75 & auVar66 | auVar67;
    auVar41 = packssdw(auVar41,auVar41);
    auVar61._8_4_ = 0xffffffff;
    auVar61._0_8_ = 0xffffffffffffffff;
    auVar61._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41 ^ auVar61,auVar41 ^ auVar61);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
      pEVar15[2].storage.data[0] = (char)lVar82 + '\x01';
    }
    auVar41 = pshufhw(auVar41,auVar66,0x84);
    auVar48 = pshufhw(auVar66,auVar75,0x84);
    auVar43 = pshufhw(auVar41,auVar67,0x84);
    auVar23._8_4_ = 0xffffffff;
    auVar23._0_8_ = 0xffffffffffffffff;
    auVar23._12_4_ = 0xffffffff;
    auVar23 = (auVar43 | auVar48 & auVar41) ^ auVar23;
    auVar41 = packssdw(auVar23,auVar23);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._0_4_ >> 0x18 & 1) != 0) {
      pEVar15[3].storage.data[0] = (char)lVar83 + '\x01';
    }
    auVar41 = (auVar70 | _DAT_0017ea90) ^ _DAT_00178230;
    auVar62._0_4_ = -(uint)(iVar71 < auVar41._0_4_);
    auVar62._4_4_ = -(uint)(iVar72 < auVar41._4_4_);
    auVar62._8_4_ = -(uint)(iVar45 < auVar41._8_4_);
    auVar62._12_4_ = -(uint)(iVar46 < auVar41._12_4_);
    auVar76._4_4_ = auVar62._0_4_;
    auVar76._0_4_ = auVar62._0_4_;
    auVar76._8_4_ = auVar62._8_4_;
    auVar76._12_4_ = auVar62._8_4_;
    auVar48 = pshuflw(auVar67,auVar76,0xe8);
    auVar24._0_4_ = -(uint)(auVar41._0_4_ == iVar71);
    auVar24._4_4_ = -(uint)(auVar41._4_4_ == iVar72);
    auVar24._8_4_ = -(uint)(auVar41._8_4_ == iVar45);
    auVar24._12_4_ = -(uint)(auVar41._12_4_ == iVar46);
    auVar49._4_4_ = auVar24._4_4_;
    auVar49._0_4_ = auVar24._4_4_;
    auVar49._8_4_ = auVar24._12_4_;
    auVar49._12_4_ = auVar24._12_4_;
    auVar41 = pshuflw(auVar24,auVar49,0xe8);
    auVar50._4_4_ = auVar62._4_4_;
    auVar50._0_4_ = auVar62._4_4_;
    auVar50._8_4_ = auVar62._12_4_;
    auVar50._12_4_ = auVar62._12_4_;
    auVar43 = pshuflw(auVar62,auVar50,0xe8);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41 & auVar48,(auVar43 | auVar41 & auVar48) ^ auVar4);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pEVar15[4].storage.data[0] = (char)lVar39 + '\x01';
    }
    auVar50 = auVar49 & auVar76 | auVar50;
    auVar43 = packssdw(auVar50,auVar50);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41,auVar43 ^ auVar5);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._4_2_ >> 8 & 1) != 0) {
      pEVar15[5].storage.data[0] = (char)lVar40 + '\x01';
    }
    auVar41 = (auVar70 | _DAT_0017ea80) ^ _DAT_00178230;
    iVar47 = -(uint)(iVar71 < auVar41._0_4_);
    iVar59 = -(uint)(iVar72 < auVar41._4_4_);
    iVar58 = -(uint)(iVar45 < auVar41._8_4_);
    iVar60 = -(uint)(iVar46 < auVar41._12_4_);
    auVar51._4_4_ = iVar47;
    auVar51._0_4_ = iVar47;
    auVar51._8_4_ = iVar58;
    auVar51._12_4_ = iVar58;
    iVar47 = -(uint)(auVar41._4_4_ == iVar72);
    iVar58 = -(uint)(auVar41._12_4_ == iVar46);
    auVar68._4_4_ = iVar47;
    auVar68._0_4_ = iVar47;
    auVar68._8_4_ = iVar58;
    auVar68._12_4_ = iVar58;
    auVar77._4_4_ = iVar59;
    auVar77._0_4_ = iVar59;
    auVar77._8_4_ = iVar60;
    auVar77._12_4_ = iVar60;
    auVar41 = auVar68 & auVar51 | auVar77;
    auVar41 = packssdw(auVar41,auVar41);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41 ^ auVar6,auVar41 ^ auVar6);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pEVar15[6].storage.data[0] = (char)lVar37 + '\x01';
    }
    auVar41 = pshufhw(auVar41,auVar51,0x84);
    auVar48 = pshufhw(auVar51,auVar68,0x84);
    auVar43 = pshufhw(auVar41,auVar77,0x84);
    auVar25._8_4_ = 0xffffffff;
    auVar25._0_8_ = 0xffffffffffffffff;
    auVar25._12_4_ = 0xffffffff;
    auVar25 = (auVar43 | auVar48 & auVar41) ^ auVar25;
    auVar41 = packssdw(auVar25,auVar25);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._6_2_ >> 8 & 1) != 0) {
      pEVar15[7].storage.data[0] = (char)lVar38 + '\x01';
    }
    auVar41 = (auVar70 | _DAT_0017ea70) ^ _DAT_00178230;
    auVar63._0_4_ = -(uint)(iVar71 < auVar41._0_4_);
    auVar63._4_4_ = -(uint)(iVar72 < auVar41._4_4_);
    auVar63._8_4_ = -(uint)(iVar45 < auVar41._8_4_);
    auVar63._12_4_ = -(uint)(iVar46 < auVar41._12_4_);
    auVar78._4_4_ = auVar63._0_4_;
    auVar78._0_4_ = auVar63._0_4_;
    auVar78._8_4_ = auVar63._8_4_;
    auVar78._12_4_ = auVar63._8_4_;
    auVar48 = pshuflw(auVar68,auVar78,0xe8);
    auVar26._0_4_ = -(uint)(auVar41._0_4_ == iVar71);
    auVar26._4_4_ = -(uint)(auVar41._4_4_ == iVar72);
    auVar26._8_4_ = -(uint)(auVar41._8_4_ == iVar45);
    auVar26._12_4_ = -(uint)(auVar41._12_4_ == iVar46);
    auVar52._4_4_ = auVar26._4_4_;
    auVar52._0_4_ = auVar26._4_4_;
    auVar52._8_4_ = auVar26._12_4_;
    auVar52._12_4_ = auVar26._12_4_;
    auVar41 = pshuflw(auVar26,auVar52,0xe8);
    auVar53._4_4_ = auVar63._4_4_;
    auVar53._0_4_ = auVar63._4_4_;
    auVar53._8_4_ = auVar63._12_4_;
    auVar53._12_4_ = auVar63._12_4_;
    auVar43 = pshuflw(auVar63,auVar53,0xe8);
    auVar64._8_4_ = 0xffffffff;
    auVar64._0_8_ = 0xffffffffffffffff;
    auVar64._12_4_ = 0xffffffff;
    auVar64 = (auVar43 | auVar41 & auVar48) ^ auVar64;
    auVar43 = packssdw(auVar64,auVar64);
    auVar41 = packsswb(auVar41 & auVar48,auVar43);
    if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar15[8].storage.data[0] = (char)lVar35 + '\x01';
    }
    auVar53 = auVar52 & auVar78 | auVar53;
    auVar43 = packssdw(auVar53,auVar53);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar43 = packssdw(auVar43 ^ auVar7,auVar43 ^ auVar7);
    auVar41 = packsswb(auVar41,auVar43);
    if ((auVar41._8_2_ >> 8 & 1) != 0) {
      pEVar15[9].storage.data[0] = (char)lVar36 + '\x01';
    }
    auVar41 = (auVar70 | _DAT_0017ea60) ^ _DAT_00178230;
    iVar47 = -(uint)(iVar71 < auVar41._0_4_);
    iVar59 = -(uint)(iVar72 < auVar41._4_4_);
    iVar58 = -(uint)(iVar45 < auVar41._8_4_);
    iVar60 = -(uint)(iVar46 < auVar41._12_4_);
    auVar54._4_4_ = iVar47;
    auVar54._0_4_ = iVar47;
    auVar54._8_4_ = iVar58;
    auVar54._12_4_ = iVar58;
    iVar47 = -(uint)(auVar41._4_4_ == iVar72);
    iVar58 = -(uint)(auVar41._12_4_ == iVar46);
    auVar69._4_4_ = iVar47;
    auVar69._0_4_ = iVar47;
    auVar69._8_4_ = iVar58;
    auVar69._12_4_ = iVar58;
    auVar79._4_4_ = iVar59;
    auVar79._0_4_ = iVar59;
    auVar79._8_4_ = iVar60;
    auVar79._12_4_ = iVar60;
    auVar41 = auVar69 & auVar54 | auVar79;
    auVar41 = packssdw(auVar41,auVar41);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41 ^ auVar8,auVar41 ^ auVar8);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      pEVar15[10].storage.data[0] = (char)lVar33 + '\x01';
    }
    auVar41 = pshufhw(auVar41,auVar54,0x84);
    auVar48 = pshufhw(auVar54,auVar69,0x84);
    auVar43 = pshufhw(auVar41,auVar79,0x84);
    auVar27._8_4_ = 0xffffffff;
    auVar27._0_8_ = 0xffffffffffffffff;
    auVar27._12_4_ = 0xffffffff;
    auVar27 = (auVar43 | auVar48 & auVar41) ^ auVar27;
    auVar41 = packssdw(auVar27,auVar27);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._10_2_ >> 8 & 1) != 0) {
      pEVar15[0xb].storage.data[0] = (char)lVar34 + '\x01';
    }
    auVar41 = (auVar70 | _DAT_0017ea50) ^ _DAT_00178230;
    auVar65._0_4_ = -(uint)(iVar71 < auVar41._0_4_);
    auVar65._4_4_ = -(uint)(iVar72 < auVar41._4_4_);
    auVar65._8_4_ = -(uint)(iVar45 < auVar41._8_4_);
    auVar65._12_4_ = -(uint)(iVar46 < auVar41._12_4_);
    auVar80._4_4_ = auVar65._0_4_;
    auVar80._0_4_ = auVar65._0_4_;
    auVar80._8_4_ = auVar65._8_4_;
    auVar80._12_4_ = auVar65._8_4_;
    auVar48 = pshuflw(auVar69,auVar80,0xe8);
    auVar28._0_4_ = -(uint)(auVar41._0_4_ == iVar71);
    auVar28._4_4_ = -(uint)(auVar41._4_4_ == iVar72);
    auVar28._8_4_ = -(uint)(auVar41._8_4_ == iVar45);
    auVar28._12_4_ = -(uint)(auVar41._12_4_ == iVar46);
    auVar55._4_4_ = auVar28._4_4_;
    auVar55._0_4_ = auVar28._4_4_;
    auVar55._8_4_ = auVar28._12_4_;
    auVar55._12_4_ = auVar28._12_4_;
    auVar41 = pshuflw(auVar28,auVar55,0xe8);
    auVar56._4_4_ = auVar65._4_4_;
    auVar56._0_4_ = auVar65._4_4_;
    auVar56._8_4_ = auVar65._12_4_;
    auVar56._12_4_ = auVar65._12_4_;
    auVar43 = pshuflw(auVar65,auVar56,0xe8);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41 & auVar48,(auVar43 | auVar41 & auVar48) ^ auVar9);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pEVar15[0xc].storage.data[0] = (char)lVar31 + '\x01';
    }
    auVar56 = auVar55 & auVar80 | auVar56;
    auVar43 = packssdw(auVar56,auVar56);
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41,auVar43 ^ auVar10);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._12_2_ >> 8 & 1) != 0) {
      pEVar15[0xd].storage.data[0] = (char)lVar32 + '\x01';
    }
    auVar41 = (auVar70 | _DAT_0017ea40) ^ _DAT_00178230;
    auVar29._0_4_ = -(uint)(iVar71 < auVar41._0_4_);
    auVar29._4_4_ = -(uint)(iVar72 < auVar41._4_4_);
    auVar29._8_4_ = -(uint)(iVar45 < auVar41._8_4_);
    auVar29._12_4_ = -(uint)(iVar46 < auVar41._12_4_);
    auVar57._4_4_ = auVar29._0_4_;
    auVar57._0_4_ = auVar29._0_4_;
    auVar57._8_4_ = auVar29._8_4_;
    auVar57._12_4_ = auVar29._8_4_;
    iVar71 = -(uint)(auVar41._4_4_ == iVar72);
    iVar72 = -(uint)(auVar41._12_4_ == iVar46);
    auVar44._4_4_ = iVar71;
    auVar44._0_4_ = iVar71;
    auVar44._8_4_ = iVar72;
    auVar44._12_4_ = iVar72;
    in_XMM12._4_4_ = auVar29._4_4_;
    in_XMM12._0_4_ = auVar29._4_4_;
    in_XMM12._8_4_ = auVar29._12_4_;
    in_XMM12._12_4_ = auVar29._12_4_;
    in_XMM10 = auVar44 & auVar57 | in_XMM12;
    auVar41 = packssdw(auVar29,in_XMM10);
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    auVar41 = packssdw(auVar41 ^ auVar11,auVar41 ^ auVar11);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pEVar15[0xe].storage.data[0] = (char)lVar73 + '\x01';
    }
    auVar41 = pshufhw(auVar41,auVar57,0x84);
    auVar48 = pshufhw(auVar44,auVar44,0x84);
    auVar43 = pshufhw(auVar41,in_XMM12,0x84);
    auVar30._8_4_ = 0xffffffff;
    auVar30._0_8_ = 0xffffffffffffffff;
    auVar30._12_4_ = 0xffffffff;
    auVar30 = (auVar43 | auVar48 & auVar41) ^ auVar30;
    auVar41 = packssdw(auVar30,auVar30);
    auVar41 = packsswb(auVar41,auVar41);
    if ((auVar41._14_2_ >> 8 & 1) != 0) {
      pEVar15[0xf].storage.data[0] = (char)lVar81 + '\x01';
    }
    uVar18 = uVar18 + 0x10;
    uVar20 = uVar20 + 0x10;
    lVar21 = lVar21 + 0x10;
    lVar82 = lVar82 + 0x10;
    lVar83 = lVar83 + 0x10;
    lVar39 = lVar39 + 0x10;
    lVar40 = lVar40 + 0x10;
    lVar37 = lVar37 + 0x10;
    lVar38 = lVar38 + 0x10;
    lVar35 = lVar35 + 0x10;
    lVar36 = lVar36 + 0x10;
    lVar33 = lVar33 + 0x10;
    lVar34 = lVar34 + 0x10;
    lVar31 = lVar31 + 0x10;
    lVar32 = lVar32 + 0x10;
    lVar73 = lVar73 + 0x10;
    lVar81 = lVar81 + 0x10;
    pEVar15 = pEVar15 + 0x10;
  } while ((lVar16 + 0xfU & 0xfffffffffffffff0) != uVar18);
LAB_00161472:
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar13;
  this->allocated = (uchar)lVar19;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }